

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_TestConflictingMessageNames_Test
::TestBody(GeneratedMessageTest_TestConflictingMessageNames_Test *this)

{
  bool bVar1;
  char *message_00;
  AssertHelper local_68;
  Message local_60;
  int local_58;
  int32_t local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  undefined1 local_30 [8];
  NULL_ message;
  GeneratedMessageTest_TestConflictingMessageNames_Test *this_local;
  
  message._24_8_ = this;
  proto2_unittest::NULL_::NULL_((NULL_ *)local_30);
  proto2_unittest::NULL_::set_int_((NULL_ *)local_30,0x7b);
  local_54 = proto2_unittest::NULL_::int_((NULL_ *)local_30);
  local_58 = 0x7b;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_50,"message.int_()","123",&local_54,&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.cc"
               ,0x87,message_00);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  proto2_unittest::NULL_::~NULL_((NULL_ *)local_30);
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, TestConflictingMessageNames) {
  proto2_unittest::NULL_ message;
  message.set_int_(123);
  EXPECT_EQ(message.int_(), 123);
}